

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFFormFieldObjectHelper.cc
# Opt level: O0

void __thiscall
QPDFFormFieldObjectHelper::setCheckBoxValue(QPDFFormFieldObjectHelper *this,bool value)

{
  bool bVar1;
  string *key;
  ulong uVar2;
  allocator<char> local_2e9;
  string local_2e8;
  allocator<char> local_2c1;
  string local_2c0;
  undefined1 local_2a0 [40];
  string local_278;
  byte local_252;
  allocator<char> local_251;
  string local_250;
  undefined1 local_230 [8];
  QPDFObjectHandle name;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
  *item;
  iterator __end3;
  iterator __begin3;
  string local_200 [32];
  QPDFObjectHandle local_1e0;
  Dictionary local_1d0;
  Dictionary *local_1c0;
  Dictionary *__range3;
  string on_value;
  allocator<char> local_181;
  string local_180 [32];
  QPDFObjectHandle local_160;
  string *local_150;
  QPDFObjectHandle *kid;
  __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
  local_140;
  iterator __end2;
  iterator __begin2;
  string local_128 [32];
  undefined1 local_108 [56];
  Array *local_d0;
  Array *__range2;
  string local_c0 [32];
  QPDFObjectHandle kids;
  QPDFObjectHandle annot;
  allocator<char> local_59;
  string local_58 [32];
  undefined1 local_38 [24];
  QPDFObjectHandle AP;
  bool value_local;
  QPDFFormFieldObjectHelper *this_local;
  
  AP.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._7_1_ = value;
  QPDFObjectHelper::oh((QPDFObjectHelper *)local_38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_58,"/AP",&local_59);
  QPDFObjectHandle::getKey((QPDFObjectHandle *)(local_38 + 0x10),(string *)local_38);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator(&local_59);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_38);
  QPDFObjectHandle::QPDFObjectHandle
            ((QPDFObjectHandle *)
             &kids.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  bVar1 = ::qpdf::BaseHandle::null((BaseHandle *)(local_38 + 0x10));
  if (bVar1) {
    QPDFObjectHelper::oh((QPDFObjectHelper *)&stack0xffffffffffffff60);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_c0,"/Kids",(allocator<char> *)((long)&__range2 + 7));
    QPDFObjectHandle::getKey
              ((QPDFObjectHandle *)&stack0xffffffffffffff70,(string *)&stack0xffffffffffffff60);
    std::__cxx11::string::~string(local_c0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range2 + 7));
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&stack0xffffffffffffff60);
    QPDFObjectHelper::oh((QPDFObjectHelper *)local_108);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_128,"/Kids",(allocator<char> *)((long)&__begin2._M_current + 7));
    QPDFObjectHandle::getKey((QPDFObjectHandle *)(local_108 + 0x10),(string *)local_108);
    QPDFObjectHandle::as_array
              ((Array *)(local_108 + 0x20),(QPDFObjectHandle *)(local_108 + 0x10),strict);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)(local_108 + 0x10));
    std::__cxx11::string::~string(local_128);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__begin2._M_current + 7));
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_108);
    local_d0 = (Array *)(local_108 + 0x20);
    __end2 = ::qpdf::Array::begin(local_d0);
    local_140._M_current = (QPDFObjectHandle *)::qpdf::Array::end(local_d0);
    while (bVar1 = __gnu_cxx::operator!=(&__end2,&local_140), bVar1) {
      key = (string *)
            __gnu_cxx::
            __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
            ::operator*(&__end2);
      local_150 = key;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_180,"/AP",&local_181);
      QPDFObjectHandle::getKey(&local_160,key);
      QPDFObjectHandle::operator=((QPDFObjectHandle *)(local_38 + 0x10),&local_160);
      QPDFObjectHandle::~QPDFObjectHandle(&local_160);
      std::__cxx11::string::~string(local_180);
      std::allocator<char>::~allocator(&local_181);
      bVar1 = ::qpdf::BaseHandle::null((BaseHandle *)(local_38 + 0x10));
      if (!bVar1) {
        QTC::TC("qpdf","QPDFFormFieldObjectHelper checkbox kid widget",0);
        QPDFObjectHandle::operator=
                  ((QPDFObjectHandle *)
                   &kids.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                   (QPDFObjectHandle *)local_150);
        break;
      }
      __gnu_cxx::
      __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
      ::operator++(&__end2);
    }
    kid._4_4_ = 2;
    ::qpdf::Array::~Array((Array *)(local_108 + 0x20));
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&stack0xffffffffffffff70);
  }
  else {
    QPDFObjectHelper::oh((QPDFObjectHelper *)((long)&on_value.field_2 + 8));
    QPDFObjectHandle::operator=
              ((QPDFObjectHandle *)
               &kids.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount,(QPDFObjectHandle *)((long)&on_value.field_2 + 8));
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)((long)&on_value.field_2 + 8));
  }
  std::__cxx11::string::string((string *)&__range3);
  if ((AP.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi._7_1_ & 1) != 0) {
    bVar1 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)(local_38 + 0x10));
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_200,"/N",(allocator<char> *)((long)&__begin3._M_node + 7));
      QPDFObjectHandle::getKey(&local_1e0,(string *)(local_38 + 0x10));
      QPDFObjectHandle::as_dictionary((QPDFObjectHandle *)&local_1d0,(typed)&local_1e0);
      QPDFObjectHandle::~QPDFObjectHandle(&local_1e0);
      std::__cxx11::string::~string(local_200);
      std::allocator<char>::~allocator((allocator<char> *)((long)&__begin3._M_node + 7));
      local_1c0 = &local_1d0;
      __end3 = ::qpdf::BaseDictionary::begin_abi_cxx11_(&local_1c0->super_BaseDictionary);
      item = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
              *)::qpdf::BaseDictionary::end_abi_cxx11_(&local_1c0->super_BaseDictionary);
      while (bVar1 = std::operator!=(&__end3,(_Self *)&item), bVar1) {
        name.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>
             ::operator*(&__end3);
        bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )name.super_BaseHandle.obj.
                                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi,"/Off");
        if (bVar1) {
          std::__cxx11::string::operator=
                    ((string *)&__range3,
                     (string *)
                     name.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
          break;
        }
        std::
        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>
        ::operator++(&__end3);
      }
      kid._4_4_ = 4;
      ::qpdf::Dictionary::~Dictionary(&local_1d0);
    }
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) != 0) {
      std::__cxx11::string::operator=((string *)&__range3,"/Yes");
    }
  }
  local_252 = 0;
  if ((AP.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi._7_1_ & 1) == 0) {
    std::allocator<char>::allocator();
    local_252 = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_250,"/Off",&local_251);
  }
  else {
    std::__cxx11::string::string((string *)&local_250,(string *)&__range3);
  }
  QPDFObjectHandle::newName((QPDFObjectHandle *)local_230,&local_250);
  std::__cxx11::string::~string((string *)&local_250);
  if ((local_252 & 1) != 0) {
    std::allocator<char>::~allocator(&local_251);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_278,"/V",(allocator<char> *)(local_2a0 + 0x27));
  QPDFObjectHandle::QPDFObjectHandle
            ((QPDFObjectHandle *)(local_2a0 + 0x10),(QPDFObjectHandle *)local_230);
  setFieldAttribute(this,&local_278,(QPDFObjectHandle *)(local_2a0 + 0x10));
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)(local_2a0 + 0x10));
  std::__cxx11::string::~string((string *)&local_278);
  std::allocator<char>::~allocator((allocator<char> *)(local_2a0 + 0x27));
  bVar1 = ::qpdf::BaseHandle::operator_cast_to_bool
                    ((BaseHandle *)
                     &kids.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  if (bVar1) {
    QTC::TC("qpdf","QPDFFormFieldObjectHelper set checkbox AS",0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e8,"/AS",&local_2e9);
    QPDFObjectHandle::replaceKey
              ((QPDFObjectHandle *)
               &kids.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount,&local_2e8,(QPDFObjectHandle *)local_230);
    std::__cxx11::string::~string((string *)&local_2e8);
    std::allocator<char>::~allocator(&local_2e9);
  }
  else {
    QTC::TC("qpdf","QPDFObjectHandle broken checkbox",0);
    QPDFObjectHelper::oh((QPDFObjectHelper *)local_2a0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2c0,"unable to set the value of this checkbox",&local_2c1);
    QPDFObjectHandle::warnIfPossible((QPDFObjectHandle *)local_2a0,&local_2c0);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::allocator<char>::~allocator(&local_2c1);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_2a0);
  }
  kid._4_4_ = (uint)!bVar1;
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_230);
  std::__cxx11::string::~string((string *)&__range3);
  QPDFObjectHandle::~QPDFObjectHandle
            ((QPDFObjectHandle *)
             &kids.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)(local_38 + 0x10));
  return;
}

Assistant:

void
QPDFFormFieldObjectHelper::setCheckBoxValue(bool value)
{
    QPDFObjectHandle AP = oh().getKey("/AP");
    QPDFObjectHandle annot;
    if (AP.null()) {
        // The widget may be below. If there is more than one, just
        // find the first one.
        QPDFObjectHandle kids = oh().getKey("/Kids");
        for (auto const& kid: oh().getKey("/Kids").as_array(qpdf::strict)) {
            AP = kid.getKey("/AP");
            if (!AP.null()) {
                QTC::TC("qpdf", "QPDFFormFieldObjectHelper checkbox kid widget");
                annot = kid;
                break;
            }
        }
    } else {
        annot = oh();
    }
    std::string on_value;
    if (value) {
        // Set the "on" value to the first value in the appearance stream's normal state dictionary
        // that isn't /Off. If not found, fall back to /Yes.
        if (AP.isDictionary()) {
            for (auto const& item: AP.getKey("/N").as_dictionary()) {
                if (item.first != "/Off") {
                    on_value = item.first;
                    break;
                }
            }
        }
        if (on_value.empty()) {
            on_value = "/Yes";
        }
    }

    // Set /AS to the on value or /Off in addition to setting /V.
    QPDFObjectHandle name = QPDFObjectHandle::newName(value ? on_value : "/Off");
    setFieldAttribute("/V", name);
    if (!annot) {
        QTC::TC("qpdf", "QPDFObjectHandle broken checkbox");
        oh().warnIfPossible("unable to set the value of this checkbox");
        return;
    }
    QTC::TC("qpdf", "QPDFFormFieldObjectHelper set checkbox AS");
    annot.replaceKey("/AS", name);
}